

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * CreateLiteralCopy(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  ExprBoolLiteral *pEVar1;
  ExprCharacterLiteral *pEVar2;
  ExprIntegerLiteral *pEVar3;
  ExprRationalLiteral *pEVar4;
  ExprRationalLiteral *node_3;
  ExprIntegerLiteral *node_2;
  ExprCharacterLiteral *node_1;
  ExprBoolLiteral *node;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  pEVar1 = getType<ExprBoolLiteral>(value);
  if (pEVar1 == (ExprBoolLiteral *)0x0) {
    pEVar2 = getType<ExprCharacterLiteral>(value);
    if (pEVar2 == (ExprCharacterLiteral *)0x0) {
      pEVar3 = getType<ExprIntegerLiteral>(value);
      if (pEVar3 == (ExprIntegerLiteral *)0x0) {
        pEVar4 = getType<ExprRationalLiteral>(value);
        if (pEVar4 == (ExprRationalLiteral *)0x0) {
          anon_unknown.dwarf_6f1cc::Stop(ctx,source,"ERROR: unknown literal type");
          ctx_local = (ExpressionContext *)0x0;
        }
        else {
          ctx_local = (ExpressionContext *)ExpressionContext::get<ExprRationalLiteral>(ctx);
          ExprRationalLiteral::ExprRationalLiteral
                    ((ExprRationalLiteral *)ctx_local,source,(pEVar4->super_ExprBase).type,
                     pEVar4->value);
        }
      }
      else {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprIntegerLiteral>(ctx);
        ExprIntegerLiteral::ExprIntegerLiteral
                  ((ExprIntegerLiteral *)ctx_local,source,(pEVar3->super_ExprBase).type,
                   pEVar3->value);
      }
    }
    else {
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprCharacterLiteral>(ctx);
      ExprCharacterLiteral::ExprCharacterLiteral
                ((ExprCharacterLiteral *)ctx_local,source,(pEVar2->super_ExprBase).type,
                 (pEVar2->super_ExprBase).field_0x29);
    }
  }
  else {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprBoolLiteral>(ctx);
    ExprBoolLiteral::ExprBoolLiteral
              ((ExprBoolLiteral *)ctx_local,source,(pEVar1->super_ExprBase).type,
               (bool)((pEVar1->super_ExprBase).field_0x29 & 1));
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateLiteralCopy(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(ExprBoolLiteral *node = getType<ExprBoolLiteral>(value))
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, node->type, node->value);

	if(ExprCharacterLiteral *node = getType<ExprCharacterLiteral>(value))
		return new (ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(source, node->type, node->value);

	if(ExprIntegerLiteral *node = getType<ExprIntegerLiteral>(value))
		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, node->type, node->value);

	if(ExprRationalLiteral *node = getType<ExprRationalLiteral>(value))
		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, node->type, node->value);

	Stop(ctx, source, "ERROR: unknown literal type");

	return NULL;
}